

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_key_push(wchar_t k)

{
  uint16_t uVar1;
  ui_event *puVar2;
  term *ptVar3;
  ulong uVar4;
  
  ptVar3 = Term;
  if (k != L'\0') {
    uVar1 = Term->key_tail;
    if (uVar1 == 0) {
      uVar1 = Term->key_size;
    }
    puVar2 = Term->key_queue;
    Term->key_tail = uVar1 - 1;
    uVar4 = (ulong)(ushort)(uVar1 - 1);
    puVar2[uVar4].type = EVT_KBRD;
    *(wchar_t *)((long)puVar2 + uVar4 * 0xc + 4) = k;
    *(undefined1 *)((long)puVar2 + uVar4 * 0xc + 8) = 0;
    return (errr)(ptVar3->key_head == ptVar3->key_tail);
  }
  return -1;
}

Assistant:

errr Term_key_push(int k)
{
	ui_event ke;

	if (!k) return (-1);

	ke.type = EVT_KBRD;
	ke.key.code = k;
	ke.key.mods = 0;

	return Term_event_push(&ke);
}